

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O0

void Qentem::Test::TestGroupValue(QTest *test)

{
  bool bVar1;
  Value<char> *pVVar2;
  StringStream<char> *pSVar3;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_f0;
  Array<Qentem::Value<char>_> local_e0;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_d0;
  undefined1 local_c0 [8];
  ValueC value2;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_98;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_88;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_78;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_68;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_58;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_48;
  undefined1 local_38 [8];
  ValueC value;
  StringStream<char> ss;
  QTest *test_local;
  
  StringStream<char>::StringStream((StringStream<char> *)&value.type_);
  Value<char>::Value((Value<char> *)local_38);
  memset(&local_48,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray(&local_48);
  Value<char>::operator+=((Value<char> *)local_38,&local_48);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_48);
  memset(&local_58,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray(&local_58);
  Value<char>::operator+=((Value<char> *)local_38,&local_58);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_58);
  memset(&local_68,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray(&local_68);
  Value<char>::operator+=((Value<char> *)local_38,&local_68);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_68);
  memset(&local_78,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray(&local_78);
  Value<char>::operator+=((Value<char> *)local_38,&local_78);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_78);
  memset(&local_88,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray(&local_88);
  Value<char>::operator+=((Value<char> *)local_38,&local_88);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_88);
  memset(&local_98,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray(&local_98);
  Value<char>::operator+=((Value<char> *)local_38,&local_98);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_98);
  memset(&value2.type_,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&value2.type_);
  Value<char>::operator+=((Value<char> *)local_38,(ObjectT *)&value2.type_);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&value2.type_);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,0);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e3);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,1);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,2);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e1);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,3);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,4);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e2);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,5);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,6);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e2);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,0);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,1);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,5);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,2);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,1);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,3);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,6);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,4);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,2);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,5);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,7);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,6);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,3);
  Value<char>::Value((Value<char> *)local_c0);
  Value<char>::GroupBy((Value<char> *)local_38,(Value<char> *)local_c0,"year");
  Value<char>::Sort((Value<char> *)local_c0,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_c0,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[122]>
            (test,pSVar3,
             (char (*) [122])
             "{\"2017\":[{\"month\":1}],\"2018\":[{\"month\":2},{\"month\":3}],\"2019\":[{\"month\":4}],\"2020\":[{\"month\":5},{\"month\":6},{\"month\":7}]}"
             ,0x1663);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Sort((Value<char> *)local_c0,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_c0,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[122]>
            (test,pSVar3,
             (char (*) [122])
             "{\"2020\":[{\"month\":5},{\"month\":6},{\"month\":7}],\"2019\":[{\"month\":4}],\"2018\":[{\"month\":2},{\"month\":3}],\"2017\":[{\"month\":1}]}"
             ,0x166b);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::GroupBy((Value<char> *)local_38,(Value<char> *)local_c0,"year");
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_c0,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[1]>(test,pSVar3,(char (*) [1])0x143336,0x1671);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,0);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e3);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,1);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,2);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e1);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,3);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,4);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e2);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,5);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,6);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e2);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,0);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,1);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,5);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,2);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,1);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,3);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,6);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,4);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,2);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,5);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,7);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,6);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,3);
  Value<char>::GroupBy((Value<char> *)local_38,(Value<char> *)local_c0,"year");
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_c0,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,pSVar3,(char (*) [3])"{}",0x1685);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,0);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e3);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,1);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,2);
  Value<char>::operator[](pVVar2,"year");
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,0);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,1);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,5);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,2);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,1);
  bVar1 = Value<char>::GroupBy((Value<char> *)local_38,(Value<char> *)local_c0,"year");
  QTest::IsFalse(test,bVar1,0x1693);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,2);
  Value<char>::Reset(pVVar2);
  Value<char>::GroupBy((Value<char> *)local_38,(Value<char> *)local_c0,"year");
  bVar1 = Value<char>::GroupBy((Value<char> *)local_38,(Value<char> *)local_c0,"year");
  QTest::IsFalse(test,bVar1,0x1697);
  memset(&local_d0,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray(&local_d0);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,2);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,&local_d0);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_d0);
  bVar1 = Value<char>::GroupBy((Value<char> *)local_38,(Value<char> *)local_c0,"year");
  QTest::IsFalse(test,bVar1,0x169a);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,4);
  Value<char>::operator+=((Value<char> *)local_c0,1);
  Value<char>::operator+=((Value<char> *)local_c0,3);
  Value<char>::operator+=((Value<char> *)local_c0,5);
  Value<char>::operator+=((Value<char> *)local_c0,2);
  Value<char>::operator+=((Value<char> *)local_c0,7);
  Value<char>::operator+=((Value<char> *)local_c0,6);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,pSVar3,(char (*) [16])"[1,2,3,4,5,6,7]",0x16ad);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,pSVar3,(char (*) [16])"[7,6,5,4,3,2,1]",0x16b4);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,5.4);
  Value<char>::operator+=((Value<char> *)local_c0,"str");
  memset(&local_e0,0,0x10);
  Array<Qentem::Value<char>_>::Array(&local_e0);
  Value<char>::operator+=((Value<char> *)local_c0,&local_e0);
  Array<Qentem::Value<char>_>::~Array(&local_e0);
  Value<char>::operator+=((Value<char> *)local_c0,(NullType)0x0);
  Value<char>::operator+=((Value<char> *)local_c0,true);
  memset(&local_f0,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray(&local_f0);
  Value<char>::operator+=((Value<char> *)local_c0,&local_f0);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_f0);
  Value<char>::operator+=((Value<char> *)local_c0,false);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,2);
  QTest::IsEqual<Qentem::StringStream<char>,char[34]>
            (test,pSVar3,(char (*) [34])"[{},[],\"str\",5.4,true,false,null]",0x16c7);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,2);
  QTest::IsEqual<Qentem::StringStream<char>,char[34]>
            (test,pSVar3,(char (*) [34])"[null,false,true,5.4,\"str\",[],{}]",0x16cd);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,-4);
  Value<char>::operator+=((Value<char> *)local_c0,-1);
  Value<char>::operator+=((Value<char> *)local_c0,-3);
  Value<char>::operator+=((Value<char> *)local_c0,-5);
  Value<char>::operator+=((Value<char> *)local_c0,-2);
  Value<char>::operator+=((Value<char> *)local_c0,-7);
  Value<char>::operator+=((Value<char> *)local_c0,-6);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[23]>
            (test,pSVar3,(char (*) [23])"[-7,-6,-5,-4,-3,-2,-1]",0x16e0);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[23]>
            (test,pSVar3,(char (*) [23])"[-1,-2,-3,-4,-5,-6,-7]",0x16e7);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,4.5);
  Value<char>::operator+=((Value<char> *)local_c0,1.5);
  Value<char>::operator+=((Value<char> *)local_c0,3.5);
  Value<char>::operator+=((Value<char> *)local_c0,5.5);
  Value<char>::operator+=((Value<char> *)local_c0,2.5);
  Value<char>::operator+=((Value<char> *)local_c0,7.5);
  Value<char>::operator+=((Value<char> *)local_c0,6.5);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar3,(char (*) [30])"[1.5,2.5,3.5,4.5,5.5,6.5,7.5]",0x16fa);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar3,(char (*) [30])"[7.5,6.5,5.5,4.5,3.5,2.5,1.5]",0x1701);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,"b");
  Value<char>::operator+=((Value<char> *)local_c0,"a");
  Value<char>::operator+=((Value<char> *)local_c0,"g");
  Value<char>::operator+=((Value<char> *)local_c0,"f");
  Value<char>::operator+=((Value<char> *)local_c0,"c");
  Value<char>::operator+=((Value<char> *)local_c0,"e");
  Value<char>::operator+=((Value<char> *)local_c0,"d");
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar3,(char (*) [30])"[\"a\",\"b\",\"c\",\"d\",\"e\",\"f\",\"g\"]",0x1713);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar3,(char (*) [30])"[\"g\",\"f\",\"e\",\"d\",\"c\",\"b\",\"a\"]",0x171a);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,0);
  Value<char>::operator+=((Value<char> *)local_c0,0);
  Value<char>::operator+=((Value<char> *)local_c0,0);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,0);
  Value<char>::operator=(pVVar2,(Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,0);
  Value<char>::operator+=((Value<char> *)local_c0,0);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,1);
  Value<char>::operator=(pVVar2,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,pSVar3,(char (*) [22])"[[0,0,0],[0,0,0,0,0]]",0x172d);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,0);
  Value<char>::operator+=((Value<char> *)local_c0,0);
  Value<char>::operator+=((Value<char> *)local_c0,0);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,0);
  Value<char>::operator=(pVVar2,(Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,0);
  Value<char>::operator+=((Value<char> *)local_c0,0);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,1);
  Value<char>::operator=(pVVar2,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,pSVar3,(char (*) [22])"[[0,0,0,0,0],[0,0,0]]",0x173e);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  pVVar2 = Value<char>::operator[]((Value<char> *)local_c0,"a");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[]((Value<char> *)local_c0,"b");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[]((Value<char> *)local_c0,"c");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,0);
  Value<char>::operator=(pVVar2,(Value<char> *)local_c0);
  pVVar2 = Value<char>::operator[]((Value<char> *)local_c0,"d");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[]((Value<char> *)local_c0,"e");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,1);
  Value<char>::operator=(pVVar2,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[54]>
            (test,pSVar3,
             (char (*) [54])"[{\"a\":0,\"b\":0,\"c\":0},{\"a\":0,\"b\":0,\"c\":0,\"d\":0,\"e\":0}]",
             0x1751);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  pVVar2 = Value<char>::operator[]((Value<char> *)local_c0,"a");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[]((Value<char> *)local_c0,"b");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[]((Value<char> *)local_c0,"c");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,0);
  Value<char>::operator=(pVVar2,(Value<char> *)local_c0);
  pVVar2 = Value<char>::operator[]((Value<char> *)local_c0,"d");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[]((Value<char> *)local_c0,"e");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)local_38,1);
  Value<char>::operator=(pVVar2,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[54]>
            (test,pSVar3,
             (char (*) [54])"[{\"a\":0,\"b\":0,\"c\":0,\"d\":0,\"e\":0},{\"a\":0,\"b\":0,\"c\":0}]",
             0x1762);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,true);
  Value<char>::operator+=((Value<char> *)local_c0,true);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar3,(char (*) [12])"[true,true]",0x1772);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar3,(char (*) [12])"[true,true]",0x1779);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,false);
  Value<char>::operator+=((Value<char> *)local_c0,false);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar3,(char (*) [14])"[false,false]",0x1787);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar3,(char (*) [14])"[false,false]",0x178e);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  Value<char>::Reset((Value<char> *)local_c0);
  Value<char>::operator+=((Value<char> *)local_c0,(NullType)0x0);
  Value<char>::operator+=((Value<char> *)local_c0,(NullType)0x0);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar3,(char (*) [12])"[null,null]",0x179b);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::operator=((Value<char> *)local_38,(Value<char> *)local_c0);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar3,(char (*) [12])"[null,null]",0x17a2);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::RemoveIndex<int>((Value<char> *)local_38,0);
  Value<char>::RemoveIndex<int>((Value<char> *)local_38,1);
  Value<char>::Sort((Value<char> *)local_38,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,pSVar3,(char (*) [3])"[]",0x17aa);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Sort((Value<char> *)local_38,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>
                     ((Value<char> *)local_38,(StringStream<char> *)&value.type_,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,pSVar3,(char (*) [3])"[]",0x17af);
  Value<char>::~Value((Value<char> *)local_c0);
  Value<char>::~Value((Value<char> *)local_38);
  StringStream<char>::~StringStream((StringStream<char> *)&value.type_);
  return;
}

Assistant:

static void TestGroupValue(QTest &test) {
    StringStream<char> ss;
    ValueC             value;

    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};

    value[0]["year"] = 2019;
    value[1]["year"] = 2020;
    value[2]["year"] = 2017;
    value[3]["year"] = 2020;
    value[4]["year"] = 2018;
    value[5]["year"] = 2020;
    value[6]["year"] = 2018;

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;
    value[3]["month"] = 6;
    value[4]["month"] = 2;
    value[5]["month"] = 7;
    value[6]["month"] = 3;

    ValueC value2;
    value.GroupBy(value2, "year");
    value2.Sort();

    test.IsEqual(
        value2.Stringify(ss),
        R"({"2017":[{"month":1}],"2018":[{"month":2},{"month":3}],"2019":[{"month":4}],"2020":[{"month":5},{"month":6},{"month":7}]})",
        __LINE__);
    ss.Clear();

    value2.Sort(false);

    test.IsEqual(
        value2.Stringify(ss),
        R"({"2020":[{"month":5},{"month":6},{"month":7}],"2019":[{"month":4}],"2018":[{"month":2},{"month":3}],"2017":[{"month":1}]})",
        __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();
    value.GroupBy(value2, "year");
    test.IsEqual(value2.Stringify(ss), R"()", __LINE__);
    ss.Clear();

    value[0]["year1"] = 2019;
    value[1]["year1"] = 2020;
    value[2]["year1"] = 2017;
    value[3]["year1"] = 2020;
    value[4]["year1"] = 2018;
    value[5]["year1"] = 2020;
    value[6]["year1"] = 2018;

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;
    value[3]["month"] = 6;
    value[4]["month"] = 2;
    value[5]["month"] = 7;
    value[6]["month"] = 3;

    value.GroupBy(value2, "year");
    test.IsEqual(value2.Stringify(ss), R"({})", __LINE__);
    ss.Clear();
    ////

    value.Reset();

    value[0]["year"] = 2019;
    value[1]["year"] = 2020;
    value[2]["year"];

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;

    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    value[2].Reset();
    value.GroupBy(value2, "year");
    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    value[2]["year"] = VHArray{};
    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += unsigned{4};
    value2 += unsigned{1};
    value2 += unsigned{3};
    value2 += unsigned{5};
    value2 += unsigned{2};
    value2 += unsigned{7};
    value2 += unsigned{6};

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([1,2,3,4,5,6,7])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([7,6,5,4,3,2,1])", __LINE__);
    ss.Clear();

    //////////////////////

    value.Reset();
    value2.Reset();

    value2 += 5.4;
    value2 += "str";
    value2 += VArray{};
    value2 += nullptr;
    value2 += true;
    value2 += VHArray{};
    value2 += false;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss, 2U), R"([{},[],"str",5.4,true,false,null])", __LINE__);
    ss.Clear();

    value = value2;
    value.Sort(false);

    test.IsEqual(value.Stringify(ss, 2U), R"([null,false,true,5.4,"str",[],{}])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += -4;
    value2 += -1;
    value2 += -3;
    value2 += -5;
    value2 += -2;
    value2 += -7;
    value2 += -6;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([-7,-6,-5,-4,-3,-2,-1])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([-1,-2,-3,-4,-5,-6,-7])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += 4.5;
    value2 += 1.5;
    value2 += 3.5;
    value2 += 5.5;
    value2 += 2.5;
    value2 += 7.5;
    value2 += 6.5;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([1.5,2.5,3.5,4.5,5.5,6.5,7.5])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([7.5,6.5,5.5,4.5,3.5,2.5,1.5])", __LINE__);
    ss.Clear();

    ///////////////////
    value.Reset();
    value2.Reset();

    value2 += "b";
    value2 += "a";
    value2 += "g";
    value2 += "f";
    value2 += "c";
    value2 += "e";
    value2 += "d";

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"(["a","b","c","d","e","f","g"])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"(["g","f","e","d","c","b","a"])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += 0;
    value2 += 0;
    value2 += 0;
    value[0] = value2;

    value2 += 0;
    value2 += 0;
    value[1] = value2;

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([[0,0,0],[0,0,0,0,0]])", __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += 0;
    value2 += 0;
    value2 += 0;
    value[0] = value2;

    value2 += 0;
    value2 += 0;
    value[1] = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([[0,0,0,0,0],[0,0,0]])", __LINE__);

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2["a"] = 0;
    value2["b"] = 0;
    value2["c"] = 0;
    value[0]    = value2;

    value2["d"] = 0;
    value2["e"] = 0;
    value[1]    = value2;

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([{"a":0,"b":0,"c":0},{"a":0,"b":0,"c":0,"d":0,"e":0}])", __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2["a"] = 0;
    value2["b"] = 0;
    value2["c"] = 0;
    value[0]    = value2;

    value2["d"] = 0;
    value2["e"] = 0;
    value[1]    = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([{"a":0,"b":0,"c":0,"d":0,"e":0},{"a":0,"b":0,"c":0}])", __LINE__);

    //////////////////////

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += true;
    value2 += true;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([true,true])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([true,true])", __LINE__);
    ss.Clear();

    //////////

    value.Reset();
    value2.Reset();

    value2 += false;
    value2 += false;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([false,false])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([false,false])", __LINE__);
    ///////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += nullptr;
    value2 += nullptr;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([null,null])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([null,null])", __LINE__);
    ss.Clear();
    ///////////
    value.RemoveIndex(0);
    value.RemoveIndex(1);

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([])", __LINE__);
    ss.Clear();

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([])", __LINE__);
    ///////////////////
}